

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Cpu.cpp
# Opt level: O1

void __thiscall Snes_Spc::end_frame(Snes_Spc *this,time_t end_time)

{
  time_t *ptVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  Snes_Spc *this_00;
  long lVar5;
  
  this_00 = this;
  if ((this->m).spc_time < end_time) {
    run_until_(this,end_time);
  }
  ptVar1 = &(this->m).spc_time;
  *ptVar1 = *ptVar1 - end_time;
  piVar2 = &(this->m).extra_clocks;
  *piVar2 = *piVar2 + end_time;
  lVar5 = 0x800;
  do {
    if (*(int *)((this->dsp).m.regs + lVar5) < 1) {
      run_timer_(this_00,(Timer *)((this->dsp).m.regs + lVar5),0);
    }
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x848);
  iVar3 = (this->m).dsp_time;
  if (iVar3 < -0x1c) {
    uVar4 = -iVar3 - 0x1dU & 0xffffffe0;
    (this->m).dsp_time = iVar3 + uVar4 + 0x20;
    Spc_Dsp::run(&this->dsp,uVar4 + 0x20);
  }
  if ((this->m).buf_begin != (sample_t_conflict1 *)0x0) {
    save_extra(this);
    return;
  }
  return;
}

Assistant:

void Snes_Spc::end_frame( time_t end_time )
{
	// Catch CPU up to as close to end as possible. If final instruction
	// would exceed end, does NOT execute it and leaves m.spc_time < end.
	if ( end_time > m.spc_time )
		run_until_( end_time );
	
	m.spc_time     -= end_time;
	m.extra_clocks += end_time;
	
	// Greatest number of clocks early that emulation can stop early due to
	// not being able to execute current instruction without going over
	// allowed time.
	assert( -cpu_lag_max <= m.spc_time && m.spc_time <= 0 );
	
	// Catch timers up to CPU
	for ( int i = 0; i < timer_count; i++ )
		run_timer( &m.timers [i], 0 );
	
	// Catch DSP up to CPU
	if ( m.dsp_time < 0 )
	{
		RUN_DSP( 0, max_reg_time );
	}
	
	// Save any extra samples beyond what should be generated
	if ( m.buf_begin )
		save_extra();
}